

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meow_hash_x64_aesni.h
# Opt level: O1

__m128i MeowHash(void *Seed128Init,unsigned_long_long Len,void *SourceInit)

{
  undefined1 (*pauVar1) [16];
  ulong uVar2;
  undefined1 (*pauVar3) [16];
  uchar *puVar4;
  uchar *rax;
  uint uVar5;
  ulong uVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  __m128i alVar27;
  
  auVar26 = ZEXT1664(MeowDefaultSeed._0_16_);
  auVar19 = ZEXT1664(MeowDefaultSeed._16_16_);
  auVar15 = ZEXT1664(MeowDefaultSeed._32_16_);
  auVar13 = ZEXT1664(MeowDefaultSeed._48_16_);
  auVar12 = ZEXT1664(MeowDefaultSeed._64_16_);
  auVar9 = ZEXT1664(MeowDefaultSeed._80_16_);
  auVar22 = ZEXT1664(MeowDefaultSeed._96_16_);
  auVar7 = ZEXT1664(MeowDefaultSeed._112_16_);
  uVar2 = (ulong)Seed128Init >> 8;
  uVar5 = (uint)Seed128Init;
  pauVar3 = (undefined1 (*) [16])Len;
  if (Seed128Init < (void *)0x40000) {
    pauVar1 = (undefined1 (*) [16])Len;
    auVar10 = MeowDefaultSeed._96_16_;
    auVar23 = MeowDefaultSeed._48_16_;
    auVar11 = MeowDefaultSeed._64_16_;
    auVar17 = MeowDefaultSeed._16_16_;
    auVar18 = MeowDefaultSeed._80_16_;
    auVar8 = MeowDefaultSeed._112_16_;
    auVar24 = MeowDefaultSeed._0_16_;
    auVar16 = MeowDefaultSeed._32_16_;
    if ((void *)0xff < Seed128Init) {
      pauVar3 = (undefined1 (*) [16])(Len + 0xf0);
      do {
        auVar14 = aesdec(auVar26._0_16_,auVar12._0_16_);
        auVar11 = vpaddq_avx(auVar22._0_16_,*(undefined1 (*) [16])(pauVar3[-0xf] + 0xf));
        auVar10 = aesdec(auVar12._0_16_ ^ pauVar3[-0xf],auVar19._0_16_);
        auVar24 = vpaddq_avx(auVar15._0_16_,*(undefined1 (*) [16])(pauVar3[-0xf] + 1));
        auVar16 = aesdec(auVar19._0_16_ ^ pauVar3[-0xe],auVar9._0_16_);
        auVar18 = vpaddq_avx(auVar7._0_16_,*(undefined1 (*) [16])(pauVar3[-0xd] + 0xf));
        auVar8 = aesdec(auVar9._0_16_ ^ pauVar3[-0xd],auVar24);
        auVar17 = vpaddq_avx(auVar13._0_16_,*(undefined1 (*) [16])(pauVar3[-0xd] + 1));
        auVar23 = aesdec(auVar24 ^ pauVar3[-0xc],auVar11);
        auVar24 = vpaddq_avx(auVar14,*(undefined1 (*) [16])(pauVar3[-0xb] + 0xf));
        auVar20 = aesdec(auVar11 ^ pauVar3[-0xb],auVar17);
        auVar11 = vpaddq_avx(auVar10,*(undefined1 (*) [16])(pauVar3[-0xb] + 1));
        auVar14 = aesdec(auVar17 ^ pauVar3[-10],auVar18);
        auVar17 = vpaddq_avx(auVar16,*(undefined1 (*) [16])(pauVar3[-9] + 0xf));
        auVar10 = aesdec(auVar18 ^ pauVar3[-9],auVar11);
        auVar18 = vpaddq_avx(auVar8,*(undefined1 (*) [16])(pauVar3[-9] + 1));
        auVar16 = aesdec(auVar11 ^ pauVar3[-8],auVar24);
        auVar8 = vpaddq_avx(auVar23,*(undefined1 (*) [16])(pauVar3[-7] + 0xf));
        auVar21 = aesdec(auVar24 ^ pauVar3[-7],auVar18);
        auVar11 = vpaddq_avx(auVar20,*(undefined1 (*) [16])(pauVar3[-7] + 1));
        auVar23 = aesdec(auVar18 ^ pauVar3[-6],auVar17);
        auVar24 = vpaddq_avx(auVar14,*(undefined1 (*) [16])(pauVar3[-5] + 0xf));
        auVar17 = aesdec(auVar17 ^ pauVar3[-5],auVar11);
        auVar18 = vpaddq_avx(auVar10,*(undefined1 (*) [16])(pauVar3[-5] + 1));
        auVar10 = aesdec(auVar11 ^ pauVar3[-4],auVar8);
        auVar22 = ZEXT1664(auVar10);
        auVar11 = vpaddq_avx(auVar16,*(undefined1 (*) [16])(pauVar3[-3] + 0xf));
        auVar12 = ZEXT1664(auVar11);
        auVar16 = aesdec(auVar8 ^ pauVar3[-3],auVar18);
        auVar15 = ZEXT1664(auVar16);
        auVar14 = vpaddq_avx(auVar21,*(undefined1 (*) [16])(pauVar3[-3] + 1));
        auVar8 = aesdec(auVar18 ^ pauVar3[-2],auVar24);
        auVar7 = ZEXT1664(auVar8);
        auVar18 = vpaddq_avx(auVar23,*(undefined1 (*) [16])(pauVar3[-1] + 0xf));
        auVar9 = ZEXT1664(auVar18);
        auVar23 = aesdec(auVar24 ^ pauVar3[-1],auVar14);
        auVar13 = ZEXT1664(auVar23);
        auVar17 = vpaddq_avx(auVar17,*(undefined1 (*) [16])(pauVar3[-1] + 1));
        auVar19 = ZEXT1664(auVar17);
        auVar24 = *pauVar3;
        auVar26 = ZEXT1664(auVar14 ^ auVar24);
        pauVar3 = pauVar3 + 0x10;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
      pauVar1 = (undefined1 (*) [16])((uVar5 & 0x3ff00) + Len);
      auVar24 = auVar14 ^ auVar24;
    }
  }
  else {
    do {
      pauVar1 = pauVar3 + 0x10;
      uVar2 = uVar2 - 1;
      auVar23 = aesdec(auVar26._0_16_,auVar12._0_16_);
      auVar11 = vpaddq_avx(auVar22._0_16_,*(undefined1 (*) [16])(*pauVar3 + 0xf));
      auVar10 = aesdec(auVar12._0_16_ ^ *pauVar3,auVar19._0_16_);
      auVar24 = vpaddq_avx(auVar15._0_16_,*(undefined1 (*) [16])(*pauVar3 + 1));
      auVar16 = aesdec(auVar19._0_16_ ^ pauVar3[1],auVar9._0_16_);
      auVar18 = vpaddq_avx(auVar7._0_16_,*(undefined1 (*) [16])(pauVar3[2] + 0xf));
      auVar8 = aesdec(auVar9._0_16_ ^ pauVar3[2],auVar24);
      auVar17 = vpaddq_avx(auVar13._0_16_,*(undefined1 (*) [16])(pauVar3[2] + 1));
      auVar14 = aesdec(auVar24 ^ pauVar3[3],auVar11);
      auVar24 = vpaddq_avx(auVar23,*(undefined1 (*) [16])(pauVar3[4] + 0xf));
      auVar20 = aesdec(auVar11 ^ pauVar3[4],auVar17);
      auVar11 = vpaddq_avx(auVar10,*(undefined1 (*) [16])(pauVar3[4] + 1));
      auVar23 = aesdec(auVar17 ^ pauVar3[5],auVar18);
      auVar17 = vpaddq_avx(auVar16,*(undefined1 (*) [16])(pauVar3[6] + 0xf));
      auVar10 = aesdec(auVar18 ^ pauVar3[6],auVar11);
      auVar18 = vpaddq_avx(auVar8,*(undefined1 (*) [16])(pauVar3[6] + 1));
      auVar16 = aesdec(auVar11 ^ pauVar3[7],auVar24);
      auVar8 = vpaddq_avx(auVar14,*(undefined1 (*) [16])(pauVar3[8] + 0xf));
      auVar24 = aesdec(auVar24 ^ pauVar3[8],auVar18);
      auVar11 = vpaddq_avx(auVar20,*(undefined1 (*) [16])(pauVar3[8] + 1));
      auVar14 = aesdec(auVar18 ^ pauVar3[9],auVar17);
      auVar23 = vpaddq_avx(auVar23,*(undefined1 (*) [16])(pauVar3[10] + 0xf));
      auVar17 = aesdec(auVar17 ^ pauVar3[10],auVar11);
      auVar18 = vpaddq_avx(auVar10,*(undefined1 (*) [16])(pauVar3[10] + 1));
      auVar10 = aesdec(auVar11 ^ pauVar3[0xb],auVar8);
      auVar22 = ZEXT1664(auVar10);
      auVar11 = vpaddq_avx(auVar16,*(undefined1 (*) [16])(pauVar3[0xc] + 0xf));
      auVar12 = ZEXT1664(auVar11);
      auVar16 = aesdec(auVar8 ^ pauVar3[0xc],auVar18);
      auVar15 = ZEXT1664(auVar16);
      auVar24 = vpaddq_avx(auVar24,*(undefined1 (*) [16])(pauVar3[0xc] + 1));
      auVar8 = aesdec(auVar18 ^ pauVar3[0xd],auVar23);
      auVar7 = ZEXT1664(auVar8);
      auVar18 = vpaddq_avx(auVar14,*(undefined1 (*) [16])(pauVar3[0xe] + 0xf));
      auVar9 = ZEXT1664(auVar18);
      auVar23 = aesdec(auVar23 ^ pauVar3[0xe],auVar24);
      auVar13 = ZEXT1664(auVar23);
      auVar17 = vpaddq_avx(auVar17,*(undefined1 (*) [16])(pauVar3[0xe] + 1));
      auVar19 = ZEXT1664(auVar17);
      auVar24 = auVar24 ^ pauVar3[0xf];
      auVar26 = ZEXT1664(auVar24);
      pauVar3 = pauVar1;
    } while (uVar2 != 0);
  }
  uVar2 = ((ulong)Seed128Init & 0xfffffffffffffff0) + Len;
  puVar4 = (uchar *)(ulong)(uVar5 & 0xf);
  auVar14 = (undefined1  [16])0x0;
  if (((ulong)Seed128Init & 0xf) != 0) {
    uVar6 = 0;
    if (((Len - 1) + (long)Seed128Init | 0xfff) - 0x10 < uVar2) {
      uVar6 = (ulong)((uint)uVar2 & 0xf);
    }
    puVar4 = "";
    auVar14 = vpshufb_avx(*(undefined1 (*) [16])(uVar2 - uVar6),*(undefined1 (*) [16])("" + uVar6));
    auVar14 = vpand_avx(auVar14,*(undefined1 (*) [16])(MeowMaskLen + (0x10 - (ulong)(uVar5 & 0xf))))
    ;
  }
  if (((ulong)Seed128Init & 0x10) == 0) {
    auVar21 = (undefined1  [16])0x0;
    auVar20 = auVar14;
  }
  else {
    auVar20 = *(undefined1 (*) [16])(uVar2 - 0x10);
    auVar21 = auVar14;
  }
  auVar14 = vpalignr_avx(auVar20,auVar21,0xf);
  auVar10 = vpaddq_avx(auVar14,auVar10);
  auVar14 = vpalignr_avx(auVar20,auVar21,1);
  auVar16 = vpaddq_avx(auVar14,auVar16);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = Seed128Init;
  auVar14 = vpsrlq_avx(auVar25,8);
  auVar23 = vpaddq_avx(auVar23,auVar14);
  auVar24 = aesdec(auVar24,auVar11);
  auVar11 = aesdec(auVar20 ^ auVar11,auVar17);
  auVar17 = aesdec(auVar21 ^ auVar17,auVar18);
  auVar18 = aesdec(auVar18,auVar16);
  auVar16 = auVar16 ^ auVar25;
  uVar5 = uVar5 >> 5 & 7;
  if (uVar5 != 0) {
    auVar16 = aesdec(auVar16,auVar10);
    auVar24 = vpaddq_avx(auVar24,*(undefined1 (*) [16])(*pauVar1 + 0xf));
    auVar10 = aesdec(auVar10 ^ *pauVar1,auVar23);
    auVar11 = vpaddq_avx(auVar11,*(undefined1 (*) [16])(*pauVar1 + 1));
    auVar23 = auVar23 ^ pauVar1[1];
    if (uVar5 != 1) {
      auVar23 = aesdec(auVar23,auVar8);
      auVar17 = vpaddq_avx(auVar17,*(undefined1 (*) [16])(pauVar1[2] + 0xf));
      auVar8 = aesdec(auVar8 ^ pauVar1[2],auVar11);
      auVar18 = vpaddq_avx(auVar18,*(undefined1 (*) [16])(pauVar1[2] + 1));
      auVar11 = auVar11 ^ pauVar1[3];
      if (uVar5 != 2) {
        auVar11 = aesdec(auVar11,auVar24);
        auVar16 = vpaddq_avx(auVar16,*(undefined1 (*) [16])(pauVar1[4] + 0xf));
        auVar24 = aesdec(auVar24 ^ pauVar1[4],auVar18);
        auVar10 = vpaddq_avx(auVar10,*(undefined1 (*) [16])(pauVar1[4] + 1));
        auVar18 = auVar18 ^ pauVar1[5];
        if (uVar5 != 3) {
          auVar18 = aesdec(auVar18,auVar17);
          auVar23 = vpaddq_avx(auVar23,*(undefined1 (*) [16])(pauVar1[6] + 0xf));
          auVar17 = aesdec(auVar17 ^ pauVar1[6],auVar10);
          auVar8 = vpaddq_avx(auVar8,*(undefined1 (*) [16])(pauVar1[6] + 1));
          auVar10 = auVar10 ^ pauVar1[7];
          if (uVar5 != 4) {
            auVar10 = aesdec(auVar10,auVar16);
            auVar11 = vpaddq_avx(auVar11,*(undefined1 (*) [16])(pauVar1[8] + 0xf));
            auVar16 = aesdec(auVar16 ^ pauVar1[8],auVar8);
            auVar24 = vpaddq_avx(auVar24,*(undefined1 (*) [16])(pauVar1[8] + 1));
            auVar8 = auVar8 ^ pauVar1[9];
            if (uVar5 != 5) {
              auVar8 = aesdec(auVar8,auVar23);
              auVar18 = vpaddq_avx(auVar18,*(undefined1 (*) [16])(pauVar1[10] + 0xf));
              auVar23 = aesdec(auVar23 ^ pauVar1[10],auVar24);
              auVar17 = vpaddq_avx(auVar17,*(undefined1 (*) [16])(pauVar1[10] + 1));
              auVar24 = auVar24 ^ pauVar1[0xb];
              if (uVar5 != 6) {
                auVar24 = aesdec(auVar24,auVar11);
                auVar10 = vpaddq_avx(auVar10,*(undefined1 (*) [16])(pauVar1[0xc] + 0xf));
                auVar11 = aesdec(auVar11 ^ pauVar1[0xc],auVar17);
                auVar16 = vpaddq_avx(auVar16,*(undefined1 (*) [16])(pauVar1[0xc] + 1));
                auVar17 = auVar17 ^ pauVar1[0xd];
              }
            }
          }
        }
      }
    }
  }
  auVar20 = aesdec(auVar24,auVar11);
  auVar24 = vpaddq_avx(auVar17,auVar18);
  auVar14 = aesdec(auVar11 ^ auVar10,auVar24);
  auVar11 = vpaddq_avx(auVar18,auVar10);
  auVar25 = aesdec(auVar24 ^ auVar16,auVar11);
  auVar24 = vpaddq_avx(auVar16,auVar10);
  auVar16 = aesdec(auVar11 ^ auVar8,auVar24);
  auVar11 = vpaddq_avx(auVar10,auVar8);
  auVar17 = aesdec(auVar24 ^ auVar23,auVar11);
  auVar24 = vpaddq_avx(auVar23,auVar8);
  auVar21 = aesdec(auVar20 ^ auVar11,auVar24);
  auVar11 = vpaddq_avx(auVar20,auVar8);
  auVar10 = aesdec(auVar14 ^ auVar24,auVar11);
  auVar24 = vpaddq_avx(auVar14,auVar20);
  auVar18 = aesdec(auVar25 ^ auVar11,auVar24);
  auVar11 = vpaddq_avx(auVar25,auVar20);
  auVar8 = aesdec(auVar16 ^ auVar24,auVar11);
  auVar24 = vpaddq_avx(auVar16,auVar25);
  auVar23 = aesdec(auVar17 ^ auVar11,auVar24);
  auVar11 = vpaddq_avx(auVar17,auVar25);
  auVar14 = aesdec(auVar21 ^ auVar24,auVar11);
  auVar24 = vpaddq_avx(auVar21,auVar17);
  auVar21 = aesdec(auVar10 ^ auVar11,auVar24);
  auVar11 = vpaddq_avx(auVar10,auVar17);
  auVar20 = aesdec(auVar18 ^ auVar24,auVar11);
  auVar24 = vpaddq_avx(auVar18,auVar10);
  auVar17 = aesdec(auVar8 ^ auVar11,auVar24);
  auVar11 = vpaddq_avx(auVar8,auVar10);
  auVar18 = aesdec(auVar23 ^ auVar24,auVar11);
  auVar24 = vpaddq_avx(auVar23,auVar8);
  auVar23 = aesdec(auVar14 ^ auVar11,auVar24);
  auVar11 = vpaddq_avx(auVar14,auVar8);
  auVar16 = aesdec(auVar21 ^ auVar24,auVar11);
  auVar24 = vpaddq_avx(auVar21,auVar14);
  auVar10 = aesdec(auVar20 ^ auVar11,auVar24);
  auVar11 = vpaddq_avx(auVar20,auVar14);
  auVar21 = aesdec(auVar17 ^ auVar24,auVar11);
  auVar24 = vpaddq_avx(auVar17,auVar20);
  auVar14 = aesdec(auVar18 ^ auVar11,auVar24);
  auVar11 = vpaddq_avx(auVar18,auVar20);
  auVar8 = aesdec(auVar23 ^ auVar24,auVar11);
  auVar24 = vpaddq_avx(auVar23,auVar18);
  auVar23 = aesdec(auVar16 ^ auVar11,auVar24);
  auVar11 = vpaddq_avx(auVar16,auVar18);
  auVar18 = aesdec(auVar10 ^ auVar24,auVar11);
  auVar24 = vpaddq_avx(auVar10,auVar16);
  auVar17 = aesdec(auVar21 ^ auVar11,auVar24);
  auVar11 = vpaddq_avx(auVar21,auVar16);
  auVar11 = vpaddq_avx(auVar11,auVar8);
  auVar24 = vpaddq_avx(auVar23,auVar14 ^ auVar24);
  auVar18 = vpaddq_avx(auVar18,auVar21);
  auVar17 = vpaddq_avx(auVar17,auVar14);
  vpaddq_avx(auVar17 ^ auVar24,auVar18 ^ auVar11);
  alVar27[1] = (longlong)puVar4;
  alVar27[0] = (longlong)pauVar1;
  return alVar27;
}

Assistant:

static meow_u128
MeowHash(void *Seed128Init, meow_umm Len, void *SourceInit)
{
    meow_u128 xmm0, xmm1, xmm2, xmm3, xmm4, xmm5, xmm6, xmm7; // NOTE(casey): xmm0-xmm7 are the hash accumulation lanes
    meow_u128 xmm8, xmm9, xmm10, xmm11, xmm12, xmm13, xmm14, xmm15; // NOTE(casey): xmm8-xmm15 hold values to be appended (residual, length)
    
    meow_u8 *rax = (meow_u8 *)SourceInit;
    meow_u8 *rcx = (meow_u8 *)Seed128Init;
    
    //
	// NOTE(casey): Seed the eight hash registers
    //
    
    movdqu(xmm0, rcx + 0x00);
    movdqu(xmm1, rcx + 0x10);
    movdqu(xmm2, rcx + 0x20);
    movdqu(xmm3, rcx + 0x30);
    
    movdqu(xmm4, rcx + 0x40);
    movdqu(xmm5, rcx + 0x50);
    movdqu(xmm6, rcx + 0x60);
    movdqu(xmm7, rcx + 0x70);
    
    MEOW_DUMP_STATE("Seed", xmm0, xmm1, xmm2, xmm3, xmm4, xmm5, xmm6, xmm7, 0);
    
    //
    // NOTE(casey): Hash all full 256-byte blocks
    //
    
    meow_umm BlockCount = (Len >> 8);
    if(BlockCount > MEOW_PREFETCH_LIMIT)
    {
        // NOTE(casey): For large input, modern Intel x64's can't hit full speed without prefetching, so we use this loop
        while(BlockCount--)
        {
            prefetcht0(rax + MEOW_PREFETCH + 0x00);
            prefetcht0(rax + MEOW_PREFETCH + 0x40);
            prefetcht0(rax + MEOW_PREFETCH + 0x80);
            prefetcht0(rax + MEOW_PREFETCH + 0xc0);
            
            MEOW_MIX(xmm0,xmm4,xmm6,xmm1,xmm2, rax + 0x00);
            MEOW_MIX(xmm1,xmm5,xmm7,xmm2,xmm3, rax + 0x20);
            MEOW_MIX(xmm2,xmm6,xmm0,xmm3,xmm4, rax + 0x40);
            MEOW_MIX(xmm3,xmm7,xmm1,xmm4,xmm5, rax + 0x60);
            MEOW_MIX(xmm4,xmm0,xmm2,xmm5,xmm6, rax + 0x80);
            MEOW_MIX(xmm5,xmm1,xmm3,xmm6,xmm7, rax + 0xa0);
            MEOW_MIX(xmm6,xmm2,xmm4,xmm7,xmm0, rax + 0xc0);
            MEOW_MIX(xmm7,xmm3,xmm5,xmm0,xmm1, rax + 0xe0);
            
            rax += 0x100;
        }
    }
    else
    {
        // NOTE(casey): For small input, modern Intel x64's can't hit full speed _with_ prefetching (because of port pressure), so we use this loop.
        while(BlockCount--)
        {
            MEOW_MIX(xmm0,xmm4,xmm6,xmm1,xmm2, rax + 0x00);
            MEOW_MIX(xmm1,xmm5,xmm7,xmm2,xmm3, rax + 0x20);
            MEOW_MIX(xmm2,xmm6,xmm0,xmm3,xmm4, rax + 0x40);
            MEOW_MIX(xmm3,xmm7,xmm1,xmm4,xmm5, rax + 0x60);
            MEOW_MIX(xmm4,xmm0,xmm2,xmm5,xmm6, rax + 0x80);
            MEOW_MIX(xmm5,xmm1,xmm3,xmm6,xmm7, rax + 0xa0);
            MEOW_MIX(xmm6,xmm2,xmm4,xmm7,xmm0, rax + 0xc0);
            MEOW_MIX(xmm7,xmm3,xmm5,xmm0,xmm1, rax + 0xe0);
            
            rax += 0x100;
        }
    }
    
    MEOW_DUMP_STATE("PostBlocks", xmm0, xmm1, xmm2, xmm3, xmm4, xmm5, xmm6, xmm7, 0);
    
    //
    // NOTE(casey): Load any less-than-32-byte residual
    //
    
    pxor_clear(xmm9, xmm9);
    pxor_clear(xmm11, xmm11);
    
    //
    // TODO(casey): I need to put more thought into how the end-of-buffer stuff is actually working out here,
    // because I _think_ it may be possible to remove the first branch (on Len8) and let the mask zero out the
    // result, but it would take a little thought to make sure it couldn't read off the end of the buffer due
    // to the & 0xf on the align computation.
    //
    
    // NOTE(casey): First, we have to load the part that is _not_ 16-byte aligned
    meow_u8 *Last = (meow_u8 *)SourceInit + (Len & ~0xf);
    int unsigned Len8 = (Len & 0xf);
    if(Len8)
    {
        // NOTE(casey): Load the mask early
        movdqu(xmm8, &MeowMaskLen[0x10 - Len8]);
        
        meow_u8 *LastOk = (meow_u8*)((((meow_umm)(((meow_u8 *)SourceInit)+Len - 1)) | (MEOW_PAGESIZE - 1)) - 16);
        int Align = (Last > LastOk) ? ((int)(meow_umm)Last) & 0xf : 0;
        movdqu(xmm10, &MeowShiftAdjust[Align]);
        movdqu(xmm9, Last - Align);
        pshufb(xmm9, xmm10);
        
        // NOTE(jeffr): and off the extra bytes
        pand(xmm9, xmm8);
    }
    
    // NOTE(casey): Next, we have to load the part that _is_ 16-byte aligned
    if(Len & 0x10)
    {
        xmm11 = xmm9;
        movdqu(xmm9, Last - 0x10);
    }
    
    //
    // NOTE(casey): Construct the residual and length injests
    //
    
    xmm8 = xmm9;
    xmm10 = xmm9;
    palignr(xmm8, xmm11, 15);
    palignr(xmm10, xmm11, 1);
    
    // NOTE(casey): We have room for a 128-bit nonce and a 64-bit none here, but
    // the decision was made to leave them zero'd so as not to confuse people
    // about hwo to use them or what security implications they had.
    pxor_clear(xmm12, xmm12);
    pxor_clear(xmm13, xmm13);
    pxor_clear(xmm14, xmm14);
    movq(xmm15, Len);
    palignr(xmm12, xmm15, 15);
    palignr(xmm14, xmm15, 1);
    
    MEOW_DUMP_STATE("Residuals", xmm8, xmm9, xmm10, xmm11, xmm12, xmm13, xmm14, xmm15, 0);
    
    // NOTE(casey): To maintain the mix-down pattern, we always Meow Mix the less-than-32-byte residual, even if it was empty
    MEOW_MIX_REG(xmm0, xmm4, xmm6, xmm1, xmm2,  xmm8, xmm9, xmm10, xmm11);
    
    // NOTE(casey): Append the length, to avoid problems with our 32-byte padding
    MEOW_MIX_REG(xmm1, xmm5, xmm7, xmm2, xmm3,  xmm12, xmm13, xmm14, xmm15);
    
    MEOW_DUMP_STATE("PostAppend", xmm0, xmm1, xmm2, xmm3, xmm4, xmm5, xmm6, xmm7, 0);
    
    //
    // NOTE(casey): Hash all full 32-byte blocks
    //
    int unsigned LaneCount = (Len >> 5) & 0x7;
    if(LaneCount == 0) goto MixDown; MEOW_MIX(xmm2,xmm6,xmm0,xmm3,xmm4, rax + 0x00); --LaneCount;
    if(LaneCount == 0) goto MixDown; MEOW_MIX(xmm3,xmm7,xmm1,xmm4,xmm5, rax + 0x20); --LaneCount;
    if(LaneCount == 0) goto MixDown; MEOW_MIX(xmm4,xmm0,xmm2,xmm5,xmm6, rax + 0x40); --LaneCount;
    if(LaneCount == 0) goto MixDown; MEOW_MIX(xmm5,xmm1,xmm3,xmm6,xmm7, rax + 0x60); --LaneCount;
    if(LaneCount == 0) goto MixDown; MEOW_MIX(xmm6,xmm2,xmm4,xmm7,xmm0, rax + 0x80); --LaneCount;
    if(LaneCount == 0) goto MixDown; MEOW_MIX(xmm7,xmm3,xmm5,xmm0,xmm1, rax + 0xa0); --LaneCount;
    if(LaneCount == 0) goto MixDown; MEOW_MIX(xmm0,xmm4,xmm6,xmm1,xmm2, rax + 0xc0); --LaneCount;
    
    //
    // NOTE(casey): Mix the eight lanes down to one 128-bit hash
    //
    
    MixDown:
    
    MEOW_DUMP_STATE("PostLanes", xmm0, xmm1, xmm2, xmm3, xmm4, xmm5, xmm6, xmm7, 0);
    
    MEOW_SHUFFLE(xmm0, xmm1, xmm2, xmm4, xmm5, xmm6);
    MEOW_SHUFFLE(xmm1, xmm2, xmm3, xmm5, xmm6, xmm7);
    MEOW_SHUFFLE(xmm2, xmm3, xmm4, xmm6, xmm7, xmm0);
    MEOW_SHUFFLE(xmm3, xmm4, xmm5, xmm7, xmm0, xmm1);
    MEOW_SHUFFLE(xmm4, xmm5, xmm6, xmm0, xmm1, xmm2);
    MEOW_SHUFFLE(xmm5, xmm6, xmm7, xmm1, xmm2, xmm3);
    MEOW_SHUFFLE(xmm6, xmm7, xmm0, xmm2, xmm3, xmm4);
    MEOW_SHUFFLE(xmm7, xmm0, xmm1, xmm3, xmm4, xmm5);
    MEOW_SHUFFLE(xmm0, xmm1, xmm2, xmm4, xmm5, xmm6);
    MEOW_SHUFFLE(xmm1, xmm2, xmm3, xmm5, xmm6, xmm7);
    MEOW_SHUFFLE(xmm2, xmm3, xmm4, xmm6, xmm7, xmm0);
    MEOW_SHUFFLE(xmm3, xmm4, xmm5, xmm7, xmm0, xmm1);
    
    MEOW_DUMP_STATE("PostMix", xmm0, xmm1, xmm2, xmm3, xmm4, xmm5, xmm6, xmm7, 0);
    
    paddq(xmm0, xmm2);
    paddq(xmm1, xmm3);
    paddq(xmm4, xmm6);
    paddq(xmm5, xmm7);
    pxor(xmm0, xmm1);
    pxor(xmm4, xmm5);
    paddq(xmm0, xmm4);
    
    MEOW_DUMP_STATE("PostFold", xmm0, xmm1, xmm2, xmm3, xmm4, xmm5, xmm6, xmm7, 0);
    
    return(xmm0);
}